

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void add_tokens(VARR_token_t *to,VARR_token_t *from)

{
  size_t sVar1;
  token_t t;
  undefined8 local_20;
  size_t i;
  VARR_token_t *from_local;
  VARR_token_t *to_local;
  
  local_20 = 0;
  while( true ) {
    sVar1 = VARR_token_tlength(from);
    if (sVar1 <= local_20) break;
    t = VARR_token_tget(from,local_20);
    add_token(to,t);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

static void add_tokens (VARR (token_t) * to, VARR (token_t) * from) {
  for (size_t i = 0; i < VARR_LENGTH (token_t, from); i++)
    add_token (to, VARR_GET (token_t, from, i));
}